

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmCommonTargetGenerator::AddModuleDefinitionFlag(cmCommonTargetGenerator *this,string *flags)

{
  cmMakefile *this_00;
  cmLocalCommonGenerator *pcVar1;
  char *pcVar2;
  string *psVar3;
  string flag;
  allocator local_38 [32];
  
  if (this->ModuleDefinitionFile != (cmSourceFile *)0x0) {
    this_00 = this->Makefile;
    std::__cxx11::string::string((string *)&flag,"CMAKE_LINK_DEF_FILE_FLAG",local_38);
    pcVar2 = cmMakefile::GetDefinition(this_00,&flag);
    std::__cxx11::string::~string((string *)&flag);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string((string *)&flag,pcVar2,local_38);
      pcVar1 = this->LocalGenerator;
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(this->ModuleDefinitionFile);
      (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xd])(local_38,pcVar1,psVar3,2);
      std::__cxx11::string::append((string *)&flag);
      std::__cxx11::string::~string((string *)local_38);
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
                (this->LocalGenerator,flags,&flag);
      std::__cxx11::string::~string((string *)&flag);
    }
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AddModuleDefinitionFlag(std::string& flags)
{
  if(!this->ModuleDefinitionFile)
    {
    return;
    }

  // TODO: Create a per-language flag variable.
  const char* defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if(!defFileFlag)
    {
    return;
    }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag = defFileFlag;
  flag += (this->LocalGenerator->ConvertToLinkReference(
             this->ModuleDefinitionFile->GetFullPath()));
  this->LocalGenerator->AppendFlags(flags, flag);
}